

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MinefieldIdentifier.h
# Opt level: O0

MinefieldIdentifier * __thiscall
DIS::MinefieldIdentifier::operator=(MinefieldIdentifier *this,MinefieldIdentifier *param_1)

{
  MinefieldIdentifier *param_1_local;
  MinefieldIdentifier *this_local;
  
  SimulationAddress::operator=(&this->_simulationAddress,&param_1->_simulationAddress);
  this->_minefieldNumber = param_1->_minefieldNumber;
  return this;
}

Assistant:

class OPENDIS7_EXPORT MinefieldIdentifier
{
protected:
  /**  */
  SimulationAddress _simulationAddress; 

  /**  */
  unsigned short _minefieldNumber; 


 public:
    MinefieldIdentifier();
    virtual ~MinefieldIdentifier();

    virtual void marshal(DataStream& dataStream) const;
    virtual void unmarshal(DataStream& dataStream);

    SimulationAddress& getSimulationAddress(); 
    const SimulationAddress&  getSimulationAddress() const; 
    void setSimulationAddress(const SimulationAddress    &pX);

    unsigned short getMinefieldNumber() const; 
    void setMinefieldNumber(unsigned short pX); 


virtual int getMarshalledSize() const;

     bool operator  ==(const MinefieldIdentifier& rhs) const;
}